

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QHttpPart *part)

{
  QDebug *pQVar1;
  QHttpPartPrivate *pQVar2;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QDebug *in_stack_ffffffffffffff80;
  Stream *this;
  Stream *headers;
  QDebug in_stack_ffffffffffffffc0;
  QDebug in_stack_ffffffffffffffc8;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  QDebug local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  headers = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  pQVar1 = (QDebug *)QDebug::resetFormat();
  pQVar1 = QDebug::nospace(pQVar1);
  QDebug::noquote(pQVar1);
  pQVar1 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::QDebug(&local_30,pQVar1);
  QSharedDataPointer<QHttpPartPrivate>::operator->((QSharedDataPointer<QHttpPartPrivate> *)0x2e4d05)
  ;
  operator<<((QDebug *)this,(QHash<QNetworkRequest::KnownHeaders,_QVariant> *)in_RDI);
  pQVar1 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::QDebug(&local_20,pQVar1);
  QSharedDataPointer<QHttpPartPrivate>::operator->((QSharedDataPointer<QHttpPartPrivate> *)0x2e4d47)
  ;
  operator<<((QDebug *)in_stack_ffffffffffffffc0.stream,(QHttpHeaders *)headers);
  QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug(&local_20);
  QDebug::~QDebug(&local_28);
  QDebug::~QDebug(&local_30);
  pQVar2 = QSharedDataPointer<QHttpPartPrivate>::operator->
                     ((QSharedDataPointer<QHttpPartPrivate> *)0x2e4da4);
  if (pQVar2->bodyDevice == (QIODevice *)0x0) {
    in_stack_ffffffffffffff80 =
         QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
    pQVar2 = QSharedDataPointer<QHttpPartPrivate>::operator->
                       ((QSharedDataPointer<QHttpPartPrivate> *)0x2e4e68);
    QByteArray::size(&pQVar2->body);
    QDebug::operator<<(in_stack_ffffffffffffff80,
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
  }
  else {
    pQVar1 = QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffc0,pQVar1);
    QSharedDataPointer<QHttpPartPrivate>::operator->
              ((QSharedDataPointer<QHttpPartPrivate> *)0x2e4dd7);
    operator<<((QDebug *)&stack0xffffffffffffffc8,(QObject *)&stack0xffffffffffffffc0);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
    QSharedDataPointer<QHttpPartPrivate>::operator->
              ((QSharedDataPointer<QHttpPartPrivate> *)0x2e4e0a);
    QIODevice::isOpen();
    QDebug::operator<<(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
    QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc8);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
  }
  QDebug::operator<<((QDebug *)this,(char *)in_stack_ffffffffffffffc8.stream);
  QDebug::QDebug(in_stack_ffffffffffffff80,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QHttpPart &part)
{
    const QDebugStateSaver saver(debug);
    debug.resetFormat().nospace().noquote();

    debug << "QHttpPart(headers = ["
          << part.d->cookedHeaders
          << "], http headers = ["
          << part.d->httpHeaders
          << "],";

    if (part.d->bodyDevice) {
        debug << " bodydevice = ["
              << part.d->bodyDevice
              << ", is open: "
              << part.d->bodyDevice->isOpen()
              << "]";
    } else {
        debug << " size of body = "
              << part.d->body.size()
              << " bytes";
    }

    debug << ")";

    return debug;
}